

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O2

uint8_t absl::lts_20250127::cord_internal::AllocatedSizeToTagUnchecked(size_t size)

{
  sbyte sVar1;
  sbyte sVar2;
  char cVar3;
  char cVar4;
  
  sVar1 = 0xc;
  if (size < 0x2001) {
    sVar1 = 6;
  }
  cVar4 = -0x48;
  if (size < 0x2001) {
    cVar4 = ':';
  }
  sVar2 = 3;
  if (0x200 < size) {
    sVar2 = sVar1;
  }
  cVar3 = '\x02';
  if (0x200 < size) {
    cVar3 = cVar4;
  }
  return cVar3 + (char)(size >> sVar2);
}

Assistant:

constexpr uint8_t AllocatedSizeToTagUnchecked(size_t size) {
  return static_cast<uint8_t>(size <= 512 ? kTagBase + size / 8
                              : size <= 8192
                                  ? kTagBase + 512 / 8 + size / 64 - 512 / 64
                                  : kTagBase + 512 / 8 + ((8192 - 512) / 64) +
                                        size / 4096 - 8192 / 4096);
}